

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O1

void __thiscall xercesc_4_0::AbstractDOMParser::initialize(AbstractDOMParser *this)

{
  GrammarResolver *this_00;
  XMLScanner *this_01;
  
  this_00 = (GrammarResolver *)XMemory::operator_new(0x50,this->fMemoryManager);
  GrammarResolver::GrammarResolver(this_00,this->fGrammarPool,this->fMemoryManager);
  this->fGrammarResolver = this_00;
  this->fURIStringPool = this_00->fStringPool;
  this_01 = XMLScannerResolver::getDefaultScanner(this->fValidator,this_00,this->fMemoryManager);
  this->fScanner = this_01;
  this_01->fDocHandler = &this->super_XMLDocumentHandler;
  this_01->fDocTypeHandler = &this->super_DocTypeHandler;
  XMLScanner::setURIStringPool(this_01,this->fURIStringPool);
  reset(this);
  return;
}

Assistant:

void AbstractDOMParser::initialize()
{
    //  Create grammar resolver and string pool to pass to the scanner
    fGrammarResolver = new (fMemoryManager) GrammarResolver(fGrammarPool, fMemoryManager);
    fURIStringPool = fGrammarResolver->getStringPool();

    //  Create a scanner and tell it what validator to use. Then set us
    //  as the document event handler so we can fill the DOM document.
    fScanner = XMLScannerResolver::getDefaultScanner(fValidator, fGrammarResolver, fMemoryManager);
    fScanner->setDocHandler(this);
    fScanner->setDocTypeHandler(this);
    fScanner->setURIStringPool(fURIStringPool);

    this->reset();
}